

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::ES>
::test_shader_compilation
          (ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string shader_source;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string base_variable_string;
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclConstructors2<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  base_variable_string.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"    float[2][2] x = float[2][2](float[4](1.0, 2.0, 3.0, 4.0));\n",
             &local_39);
  std::allocator<char>::~allocator(&local_39);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  switch(base_variable_string.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)local_70,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)local_70,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)local_70,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x814);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)local_70,(string *)shader_end_abi_cxx11_);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,(ulong)(uint)base_variable_string.field_2._12_4_,local_70);
  std::__cxx11::string::operator=
            ((string *)local_38,
             "float[2][2] x = float[2][2](float[1][4](float[4](1.0, 2.0, 3.0, 4.0)));\n\n");
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_);
  std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  switch(base_variable_string.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)local_70,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)local_70,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)local_70,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x81d);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)local_70,(string *)shader_end_abi_cxx11_);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,(ulong)(uint)base_variable_string.field_2._12_4_,local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclConstructors2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_variable_string = "    float[2][2] x = float[2][2](float[4](1.0, 2.0, 3.0, 4.0));\n";
	std::string shader_source		 = shader_start + base_variable_string;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);

	base_variable_string = "float[2][2] x = float[2][2](float[1][4](float[4](1.0, 2.0, 3.0, 4.0)));\n\n";
	shader_source		 = base_variable_string + shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);
}